

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flasher.cpp
# Opt level: O0

void __thiscall FlasherInfo::print(FlasherInfo *this)

{
  bool bVar1;
  undefined8 uVar2;
  size_type sVar3;
  ulong uVar4;
  char *pcVar5;
  reference local_28;
  uint local_18;
  byte local_11;
  uint32_t region;
  bool first;
  FlasherInfo *this_local;
  
  _region = this;
  uVar2 = std::__cxx11::string::c_str();
  printf("Device       : %s\n",uVar2);
  uVar2 = std::__cxx11::string::c_str();
  printf("Version      : %s\n",uVar2);
  printf("Address      : 0x%x\n",(ulong)this->address);
  printf("Pages        : %d\n",(ulong)this->numPages);
  printf("Page Size    : %d bytes\n",(ulong)this->pageSize);
  printf("Total Size   : %dKB\n",(ulong)(this->totalSize >> 10));
  printf("Planes       : %d\n",(ulong)this->numPlanes);
  sVar3 = std::vector<bool,_std::allocator<bool>_>::size(&this->lockRegions);
  printf("Lock Regions : %zd\n",sVar3);
  printf("Locked       : ");
  local_11 = 1;
  for (local_18 = 0; uVar4 = (ulong)local_18,
      sVar3 = std::vector<bool,_std::allocator<bool>_>::size(&this->lockRegions), uVar4 < sVar3;
      local_18 = local_18 + 1) {
    local_28 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (&this->lockRegions,(ulong)local_18);
    bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_28);
    if (bVar1) {
      pcVar5 = ",";
      if ((local_11 & 1) != 0) {
        pcVar5 = "";
      }
      printf("%s%d",pcVar5,(ulong)local_18);
      local_11 = 0;
    }
  }
  pcVar5 = "";
  if ((local_11 & 1) != 0) {
    pcVar5 = "none";
  }
  printf("%s\n",pcVar5);
  pcVar5 = "false";
  if ((this->security & 1U) != 0) {
    pcVar5 = "true";
  }
  printf("Security     : %s\n",pcVar5);
  if ((this->canBootFlash & 1U) != 0) {
    pcVar5 = "false";
    if ((this->bootFlash & 1U) != 0) {
      pcVar5 = "true";
    }
    printf("Boot Flash   : %s\n",pcVar5);
  }
  if ((this->canBod & 1U) != 0) {
    pcVar5 = "false";
    if ((this->bod & 1U) != 0) {
      pcVar5 = "true";
    }
    printf("BOD          : %s\n",pcVar5);
  }
  if ((this->canBor & 1U) != 0) {
    pcVar5 = "false";
    if ((this->bor & 1U) != 0) {
      pcVar5 = "true";
    }
    printf("BOR          : %s\n",pcVar5);
  }
  return;
}

Assistant:

void
FlasherInfo::print()
{
    bool first;

    printf("Device       : %s\n", name.c_str());
    printf("Version      : %s\n", version.c_str());
    printf("Address      : 0x%x\n", address);
    printf("Pages        : %d\n", numPages);
    printf("Page Size    : %d bytes\n", pageSize);
    printf("Total Size   : %dKB\n", totalSize / 1024);
    printf("Planes       : %d\n", numPlanes);
    printf("Lock Regions : %zd\n", lockRegions.size());
    printf("Locked       : ");
    first = true;
    for (uint32_t region = 0; region < lockRegions.size(); region++)
    {
        if (lockRegions[region])
        {
            printf("%s%d", first ? "" : ",", region);
            first = false;
        }
    }
    printf("%s\n", first ? "none" : "");
    printf("Security     : %s\n", security ? "true" : "false");
    if (canBootFlash)
        printf("Boot Flash   : %s\n", bootFlash ? "true" : "false");
    if (canBod)
        printf("BOD          : %s\n", bod ? "true" : "false");
    if (canBor)
        printf("BOR          : %s\n", bor ? "true" : "false");
}